

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O1

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::Request(ZmqReqRep *this,char *request,size_t size,string *address)

{
  vector<char,_std::allocator<char>_> *this_00;
  int iVar1;
  uint uVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined8 *in_R8;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar8;
  
  *(undefined8 *)this = 0;
  pcVar3 = (pointer)operator_new(0x28);
  pcVar3[8] = '\x01';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\x01';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  *(undefined ***)pcVar3 = &PTR___Sp_counted_ptr_inplace_00886b28;
  this_00 = (vector<char,_std::allocator<char>_> *)(pcVar3 + 0x10);
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x19] = '\0';
  pcVar3[0x1a] = '\0';
  pcVar3[0x1b] = '\0';
  pcVar3[0x1c] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  pcVar3[0x20] = '\0';
  pcVar3[0x21] = '\0';
  pcVar3[0x22] = '\0';
  pcVar3[0x23] = '\0';
  pcVar3[0x24] = '\0';
  pcVar3[0x25] = '\0';
  pcVar3[0x26] = '\0';
  pcVar3[0x27] = '\0';
  (this->m_ReceiverBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = pcVar3;
  *(vector<char,_std::allocator<char>_> **)this = this_00;
  uVar4 = zmq_socket(*(undefined8 *)(request + 0x20),3);
  iVar1 = 1;
  lVar5 = std::chrono::_V2::system_clock::now();
  do {
    if (iVar1 == 0) {
      iVar1 = -1;
      lVar5 = std::chrono::_V2::system_clock::now();
      goto LAB_0067797e;
    }
    iVar1 = zmq_connect(uVar4,*in_R8);
    zmq_setsockopt(uVar4,0x1c,request,4);
    zmq_setsockopt(uVar4,0x1b,request,4);
    zmq_setsockopt(uVar4,0x11,request,4);
    lVar6 = std::chrono::_V2::system_clock::now();
  } while ((lVar6 - lVar5) / 1000000000 <= (long)*(int *)request);
  zmq_close(uVar4);
  _Var7._M_pi = extraout_RDX;
  goto LAB_00677a79;
  while( true ) {
    iVar1 = zmq_send(uVar4,size,address,0);
    lVar6 = std::chrono::_V2::system_clock::now();
    if ((long)*(int *)request < (lVar6 - lVar5) / 1000000000) break;
LAB_0067797e:
    if (0 < iVar1) {
      uVar2 = 0xffffffff;
      lVar5 = std::chrono::_V2::system_clock::now();
      goto LAB_006779e6;
    }
  }
  zmq_close(uVar4);
  _Var7._M_pi = extraout_RDX_00;
  goto LAB_00677a79;
  while( true ) {
    uVar2 = zmq_recv(uVar4,*(long *)(request + 8),*(long *)(request + 0x18) - *(long *)(request + 8)
                     ,0);
    lVar6 = std::chrono::_V2::system_clock::now();
    if ((long)*(int *)request < (lVar6 - lVar5) / 1000000000) break;
LAB_006779e6:
    if (0 < (int)uVar2) {
      std::vector<char,_std::allocator<char>_>::resize(this_00,(ulong)uVar2);
      memcpy((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start,*(void **)(request + 8),(ulong)uVar2);
      zmq_close(uVar4);
      _Var7._M_pi = extraout_RDX_02;
      goto LAB_00677a79;
    }
  }
  zmq_close(uVar4);
  _Var7._M_pi = extraout_RDX_01;
LAB_00677a79:
  sVar8.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  sVar8.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar8.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::Request(const char *request, const size_t size,
                                                      const std::string &address)
{
    auto reply = std::make_shared<std::vector<char>>();
    void *socket = zmq_socket(m_Context, ZMQ_REQ);

    int ret = 1;
    auto start_time = std::chrono::system_clock::now();
    while (ret)
    {
        ret = zmq_connect(socket, address.c_str());
        zmq_setsockopt(socket, ZMQ_SNDTIMEO, &m_Timeout, sizeof(m_Timeout));
        zmq_setsockopt(socket, ZMQ_RCVTIMEO, &m_Timeout, sizeof(m_Timeout));
        zmq_setsockopt(socket, ZMQ_LINGER, &m_Timeout, sizeof(m_Timeout));

        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_send(socket, request, size, 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_recv(socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    reply->resize(ret);
    std::memcpy(reply->data(), m_ReceiverBuffer.data(), ret);
    zmq_close(socket);
    return reply;
}